

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::Array<unsigned_char>_>::clear(ArrayBuilder<kj::Array<unsigned_char>_> *this)

{
  uchar *puVar1;
  size_t sVar2;
  Array<unsigned_char> *pAVar3;
  Array<unsigned_char> *pAVar4;
  Array<unsigned_char> *pAVar5;
  
  pAVar4 = this->ptr;
  pAVar5 = this->pos;
  if (pAVar4 < pAVar5) {
    do {
      pAVar3 = pAVar5 + -1;
      this->pos = pAVar3;
      puVar1 = pAVar5[-1].ptr;
      if (puVar1 != (uchar *)0x0) {
        sVar2 = pAVar5[-1].size_;
        pAVar3->ptr = (uchar *)0x0;
        pAVar5[-1].size_ = 0;
        (**(pAVar5[-1].disposer)->_vptr_ArrayDisposer)(pAVar5[-1].disposer,puVar1,1,sVar2,sVar2,0);
        pAVar4 = this->ptr;
        pAVar3 = this->pos;
      }
      pAVar5 = pAVar3;
    } while (pAVar4 < pAVar5);
  }
  return;
}

Assistant:

void clear() {
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(ptr);
    } else {
      while (pos > ptr) {
        kj::dtor(*--pos);
      }
    }
  }